

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O3

void canvas_free(_glist *x)

{
  int iVar1;
  void *fatso;
  _canvasenvironment *p_Var2;
  _glist *p_Var3;
  _glist *extraout_RAX;
  _glist *extraout_RAX_00;
  _glist *p_Var4;
  _glist **pp_Var5;
  
  fatso = x->gl_privatedata;
  iVar1 = (pd_maininstance.pd_gui)->i_dspstate;
  if (iVar1 != 0) {
    canvas_stop_dsp();
  }
  canvas_noundo(x);
  if (canvas_whichfind == x) {
    canvas_whichfind = (_glist *)0x0;
  }
  glist_noselect(x);
  p_Var4 = extraout_RAX;
  while (x->gl_list != (t_gobj *)0x0) {
    glist_delete(x,x->gl_list);
    p_Var4 = extraout_RAX_00;
  }
  p_Var4 = glist_getcanvas(p_Var4);
  if (p_Var4 == x) {
    canvas_vis(x,0.0);
  }
  if (x->gl_editor != (t_editor *)0x0) {
    canvas_destroy_editor(x);
  }
  canvas_unbind(x);
  p_Var2 = x->gl_env;
  if (p_Var2 != (_canvasenvironment *)0x0) {
    freebytes(p_Var2->ce_argv,(long)p_Var2->ce_argc << 4);
    freebytes(x->gl_env,0x28);
  }
  canvas_undo_free(x);
  freebytes(fatso,0x20);
  if (iVar1 != 0) {
    canvas_start_dsp();
  }
  freebytes(x->gl_xlabel,(long)x->gl_nxlabels << 3);
  freebytes(x->gl_ylabel,(long)x->gl_nylabels << 3);
  gstub_cutoff(x->gl_stub);
  pdgui_stub_deleteforkey(x);
  if ((x->gl_owner == (_glist *)0x0) && ((x->field_0xe9 & 8) == 0)) {
    p_Var4 = pd_maininstance.pd_canvaslist;
    if (pd_maininstance.pd_canvaslist == x) {
      pp_Var5 = &pd_maininstance.pd_canvaslist;
LAB_0013803a:
      *pp_Var5 = x->gl_next;
    }
    else {
      do {
        p_Var3 = p_Var4->gl_next;
        if (p_Var3 == x) {
          pp_Var5 = &p_Var4->gl_next;
          goto LAB_0013803a;
        }
        p_Var4 = p_Var3;
      } while (p_Var3 != (_glist *)0x0);
    }
  }
  return;
}

Assistant:

void canvas_free(t_canvas *x)
{
    t_gobj *y;
    t_canvas_private*private = x->gl_privatedata;
    int dspstate = canvas_suspend_dsp();
    canvas_noundo(x);
    if (canvas_whichfind == x)
        canvas_whichfind = 0;
    glist_noselect(x);
    while ((y = x->gl_list))
        glist_delete(x, y);
    if (x == glist_getcanvas(x))
        canvas_vis(x, 0);
    if (x->gl_editor)
        canvas_destroy_editor(x);   /* bug workaround; should already be gone*/
    canvas_unbind(x);

    if (x->gl_env)
    {
        freebytes(x->gl_env->ce_argv, x->gl_env->ce_argc * sizeof(t_atom));
        freebytes(x->gl_env, sizeof(*x->gl_env));
    }
    canvas_undo_free(x);
    freebytes(private, sizeof(*private));
    canvas_resume_dsp(dspstate);
    freebytes(x->gl_xlabel, x->gl_nxlabels * sizeof(*(x->gl_xlabel)));
    freebytes(x->gl_ylabel, x->gl_nylabels * sizeof(*(x->gl_ylabel)));
    gstub_cutoff(x->gl_stub);
    pdgui_stub_deleteforkey(x);        /* probably unnecessary */
    if (!x->gl_owner && !x->gl_isclone)
        canvas_takeofflist(x);
}